

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetToken(uchar *z,int *tokenType)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *in_RSI;
  byte *in_RDI;
  bool bVar5;
  int n;
  int delim;
  int c;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_1c;
  int local_4;
  
  switch(*in_RDI) {
  case 9:
  case 10:
  case 0xc:
  case 0xd:
  case 0x20:
    local_1c = 1;
    while ((""[in_RDI[local_1c]] & 1) != 0) {
      local_1c = local_1c + 1;
    }
    *in_RSI = 0x97;
    local_4 = local_1c;
    break;
  case 0x21:
    if (in_RDI[1] == 0x3d) {
      *in_RSI = 0x4e;
      local_4 = 2;
    }
    else {
      *in_RSI = 0x96;
      local_4 = 2;
    }
    break;
  case 0x22:
  case 0x27:
  case 0x60:
    for (local_1c = 1; bVar1 = in_RDI[local_1c], bVar1 != 0; local_1c = local_1c + 1) {
      if (bVar1 == *in_RDI) {
        if (in_RDI[local_1c + 1] != *in_RDI) break;
        local_1c = local_1c + 1;
      }
    }
    if (bVar1 == 0x27) {
      *in_RSI = 0x61;
      local_4 = local_1c + 1;
    }
    else if (bVar1 == 0) {
      *in_RSI = 0x96;
      local_4 = local_1c;
    }
    else {
      *in_RSI = 0x1b;
      local_4 = local_1c + 1;
    }
    break;
  case 0x23:
  case 0x24:
  case 0x3a:
  case 0x40:
    iVar4 = 0;
    *in_RSI = 0x87;
    local_1c = 1;
    while (uVar2 = (uint)in_RDI[local_1c], uVar2 != 0) {
      if ((""[uVar2] & 0x46) == 0) {
        if ((uVar2 == 0x28) && (iVar3 = local_1c, 0 < iVar4)) goto LAB_0015de06;
        if ((uVar2 != 0x3a) || (in_RDI[local_1c + 1] != 0x3a)) break;
        local_1c = local_1c + 1;
      }
      else {
        iVar4 = iVar4 + 1;
      }
      local_1c = local_1c + 1;
    }
    goto LAB_0015dec9;
  case 0x25:
    *in_RSI = 0x5d;
    local_4 = 1;
    break;
  case 0x26:
    *in_RSI = 0x55;
    local_4 = 1;
    break;
  case 0x28:
    *in_RSI = 0x16;
    local_4 = 1;
    break;
  case 0x29:
    *in_RSI = 0x17;
    local_4 = 1;
    break;
  case 0x2a:
    *in_RSI = 0x5b;
    local_4 = 1;
    break;
  case 0x2b:
    *in_RSI = 0x59;
    local_4 = 1;
    break;
  case 0x2c:
    *in_RSI = 0x1a;
    local_4 = 1;
    break;
  case 0x2d:
    if (in_RDI[1] == 0x2d) {
      local_1c = 2;
      while (in_RDI[local_1c] != 0 && in_RDI[local_1c] != 10) {
        local_1c = local_1c + 1;
      }
      *in_RSI = 0x97;
      local_4 = local_1c;
    }
    else {
      *in_RSI = 0x5a;
      local_4 = 1;
    }
    break;
  case 0x2e:
    if ((""[in_RDI[1]] & 4) == 0) {
      *in_RSI = 0x7a;
      return 1;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    *in_RSI = 0x84;
    if ((*in_RDI == 0x30) &&
       (((in_RDI[1] == 0x78 || (in_RDI[1] == 0x58)) && ((""[in_RDI[2]] & 8) != 0)))) {
      local_1c = 3;
      while ((""[in_RDI[local_1c]] & 8) != 0) {
        local_1c = local_1c + 1;
      }
      local_4 = local_1c;
    }
    else {
      local_1c = 0;
      while ((""[in_RDI[local_1c]] & 4) != 0) {
        local_1c = local_1c + 1;
      }
      if (in_RDI[local_1c] == 0x2e) {
        do {
          local_1c = local_1c + 1;
        } while ((""[in_RDI[local_1c]] & 4) != 0);
        *in_RSI = 0x85;
      }
      if (((in_RDI[local_1c] == 0x65) || (in_RDI[local_1c] == 0x45)) &&
         (((""[in_RDI[local_1c + 1]] & 4) != 0 ||
          (((in_RDI[local_1c + 1] == 0x2b || (in_RDI[local_1c + 1] == 0x2d)) &&
           ((""[in_RDI[local_1c + 2]] & 4) != 0)))))) {
        local_1c = local_1c + 2;
        while ((""[in_RDI[local_1c]] & 4) != 0) {
          local_1c = local_1c + 1;
        }
        *in_RSI = 0x85;
      }
      while ((""[in_RDI[local_1c]] & 0x46) != 0) {
        *in_RSI = 0x96;
        local_1c = local_1c + 1;
      }
      local_4 = local_1c;
    }
    break;
  case 0x2f:
    if ((in_RDI[1] == 0x2a) && (in_RDI[2] != 0)) {
      local_1c = 3;
      bVar1 = in_RDI[2];
      while( true ) {
        if ((bVar1 != 0x2a) || (bVar5 = false, in_RDI[local_1c] != 0x2f)) {
          bVar1 = in_RDI[local_1c];
          bVar5 = bVar1 != 0;
        }
        if (!bVar5) break;
        local_1c = local_1c + 1;
      }
      if (bVar1 != 0) {
        local_1c = local_1c + 1;
      }
      *in_RSI = 0x97;
      local_4 = local_1c;
    }
    else {
      *in_RSI = 0x5c;
      local_4 = 1;
    }
    break;
  case 0x3b:
    *in_RSI = 1;
    local_4 = 1;
    break;
  case 0x3c:
    bVar1 = in_RDI[1];
    if (bVar1 == 0x3d) {
      *in_RSI = 0x51;
      local_4 = 2;
    }
    else if (bVar1 == 0x3e) {
      *in_RSI = 0x4e;
      local_4 = 2;
    }
    else if (bVar1 == 0x3c) {
      *in_RSI = 0x57;
      local_4 = 2;
    }
    else {
      *in_RSI = 0x52;
      local_4 = 1;
    }
    break;
  case 0x3d:
    *in_RSI = 0x4f;
    local_4 = (in_RDI[1] == 0x3d) + 1;
    break;
  case 0x3e:
    if (in_RDI[1] == 0x3d) {
      *in_RSI = 0x53;
      local_4 = 2;
    }
    else if (in_RDI[1] == 0x3e) {
      *in_RSI = 0x58;
      local_4 = 2;
    }
    else {
      *in_RSI = 0x50;
      local_4 = 1;
    }
    break;
  case 0x3f:
    *in_RSI = 0x87;
    local_1c = 1;
    while ((""[in_RDI[local_1c]] & 4) != 0) {
      local_1c = local_1c + 1;
    }
    local_4 = local_1c;
    break;
  case 0x58:
  case 0x78:
    if (in_RDI[1] == 0x27) {
      *in_RSI = 0x86;
      local_1c = 2;
      while ((""[in_RDI[local_1c]] & 8) != 0) {
        local_1c = local_1c + 1;
      }
      if ((in_RDI[local_1c] != 0x27) || (local_1c % 2 != 0)) {
        *in_RSI = 0x96;
        while( true ) {
          bVar5 = false;
          if (in_RDI[local_1c] != 0) {
            bVar5 = in_RDI[local_1c] != 0x27;
          }
          if (!bVar5) break;
          local_1c = local_1c + 1;
        }
      }
      if (in_RDI[local_1c] != 0) {
        local_1c = local_1c + 1;
      }
      return local_1c;
    }
  default:
    if ((""[*in_RDI] & 0x46) == 0) {
      *in_RSI = 0x96;
      local_4 = 1;
    }
    else {
      local_1c = 1;
      while ((""[in_RDI[local_1c]] & 0x46) != 0) {
        local_1c = local_1c + 1;
      }
      iVar4 = keywordCode((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      *in_RSI = iVar4;
      local_4 = local_1c;
    }
    break;
  case 0x5b:
    local_1c = 1;
    bVar1 = *in_RDI;
    while( true ) {
      bVar5 = false;
      if (bVar1 != 0x5d) {
        bVar1 = in_RDI[local_1c];
        bVar5 = bVar1 != 0;
      }
      if (!bVar5) break;
      local_1c = local_1c + 1;
    }
    iVar4 = 0x96;
    if (bVar1 == 0x5d) {
      iVar4 = 0x1b;
    }
    *in_RSI = iVar4;
    local_4 = local_1c;
    break;
  case 0x7c:
    if (in_RDI[1] == 0x7c) {
      *in_RSI = 0x5e;
      local_4 = 2;
    }
    else {
      *in_RSI = 0x56;
      local_4 = 1;
    }
    break;
  case 0x7e:
    *in_RSI = 0x60;
    local_4 = 1;
  }
  return local_4;
LAB_0015de06:
  do {
    local_1c = iVar3;
    iVar3 = local_1c + 1;
    uVar2 = (uint)in_RDI[iVar3];
    bVar5 = false;
    if ((uVar2 != 0) && (bVar5 = false, (""[uVar2] & 1) == 0)) {
      bVar5 = uVar2 != 0x29;
    }
  } while (bVar5);
  if (uVar2 == 0x29) {
    local_1c = local_1c + 2;
  }
  else {
    *in_RSI = 0x96;
    local_1c = iVar3;
  }
LAB_0015dec9:
  if (iVar4 == 0) {
    *in_RSI = 0x96;
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( *z ){
    case ' ': case '\t': case '\n': case '\f': case '\r': {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case '-': {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case '(': {
      *tokenType = TK_LP;
      return 1;
    }
    case ')': {
      *tokenType = TK_RP;
      return 1;
    }
    case ';': {
      *tokenType = TK_SEMI;
      return 1;
    }
    case '+': {
      *tokenType = TK_PLUS;
      return 1;
    }
    case '*': {
      *tokenType = TK_STAR;
      return 1;
    }
    case '/': {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case '%': {
      *tokenType = TK_REM;
      return 1;
    }
    case '=': {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case '<': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case '>': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case '!': {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 2;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case '|': {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case ',': {
      *tokenType = TK_COMMA;
      return 1;
    }
    case '&': {
      *tokenType = TK_BITAND;
      return 1;
    }
    case '~': {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case '`':
    case '\'':
    case '"': {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case '.': {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9': {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case '[': {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case '?': {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
#ifndef SQLITE_OMIT_TCL_VARIABLE
    case '$':
#endif
    case '@':  /* For compatibility with MS SQL Server */
    case '#':
    case ':': {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case 'x': case 'X': {
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
      /* Otherwise fall through to the next case */
    }
#endif
    default: {
      if( !IdChar(*z) ){
        break;
      }
      for(i=1; IdChar(z[i]); i++){}
      *tokenType = keywordCode((char*)z, i);
      return i;
    }
  }
  *tokenType = TK_ILLEGAL;
  return 1;
}